

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O1

void OPLL_set_rate(OPLL *opll,e_uint32 r)

{
  rate = 0xc234;
  if (opll->quality == 0) {
    rate = r;
  }
  internal_refresh();
  rate = r;
  return;
}

Assistant:

void
OPLL_set_rate (OPLL * opll, e_uint32 r)
{
  if (opll->quality)
    rate = 49716;
  else
    rate = r;
  internal_refresh ();
  rate = r;
}